

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O0

wchar_t add_owner_name(archive_match *a,match_list *list,wchar_t mbs,void *name)

{
  match *m;
  match *match;
  void *name_local;
  wchar_t mbs_local;
  match_list *list_local;
  archive_match *a_local;
  
  m = (match *)calloc(1,0x78);
  if (m == (match *)0x0) {
    a_local._4_4_ = error_nomem(a);
  }
  else {
    if (mbs == L'\0') {
      archive_mstring_copy_wcs(&m->pattern,(wchar_t *)name);
    }
    else {
      archive_mstring_copy_mbs(&m->pattern,(char *)name);
    }
    match_list_add(list,m);
    a->setflag = a->setflag | 4;
    a_local._4_4_ = L'\0';
  }
  return a_local._4_4_;
}

Assistant:

static int
add_owner_name(struct archive_match *a, struct match_list *list,
    int mbs, const void *name)
{
	struct match *match;

	match = calloc(1, sizeof(*match));
	if (match == NULL)
		return (error_nomem(a));
	if (mbs)
		archive_mstring_copy_mbs(&(match->pattern), name);
	else
		archive_mstring_copy_wcs(&(match->pattern), name);
	match_list_add(list, match);
	a->setflag |= ID_IS_SET;
	return (ARCHIVE_OK);
}